

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.cpp
# Opt level: O0

string * make_foreign_string<char32_t>
                   (string *__return_storage_ptr__,
                   basic_string_view<char32_t,_std::char_traits<char32_t>_> in_string)

{
  const_pointer __beg;
  const_pointer pvVar1;
  size_type sVar2;
  allocator<char> local_22;
  undefined1 local_21;
  undefined1 local_20 [8];
  basic_string_view<char32_t,_std::char_traits<char32_t>_> in_string_local;
  string *result;
  
  in_string_local._M_len = (size_t)in_string._M_str;
  local_20 = (undefined1  [8])in_string._M_len;
  local_21 = 0;
  in_string_local._M_str = (char32_t *)__return_storage_ptr__;
  __beg = std::basic_string_view<char32_t,_std::char_traits<char32_t>_>::data
                    ((basic_string_view<char32_t,_std::char_traits<char32_t>_> *)local_20);
  pvVar1 = std::basic_string_view<char32_t,_std::char_traits<char32_t>_>::data
                     ((basic_string_view<char32_t,_std::char_traits<char32_t>_> *)local_20);
  sVar2 = std::basic_string_view<char32_t,_std::char_traits<char32_t>_>::size
                    ((basic_string_view<char32_t,_std::char_traits<char32_t>_> *)local_20);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<char_const*,void>
            ((string *)__return_storage_ptr__,(char *)__beg,(char *)(pvVar1 + sVar2),&local_22);
  std::allocator<char>::~allocator(&local_22);
  jessilib::string_byteswap<char32_t>(__return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

std::string make_foreign_string(std::basic_string_view<CharT> in_string) {
	std::string result{ reinterpret_cast<const char*>(in_string.data()),
		reinterpret_cast<const char*>(in_string.data() + in_string.size()) };
	jessilib::string_byteswap<CharT>(result);

	return result;
}